

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int parse_png_file(png *z,int scan,int req_comp)

{
  bool bVar1;
  uint8 uVar2;
  int iVar3;
  uint32 uVar4;
  size_t sVar5;
  uint8 *puVar6;
  uint32 local_484;
  uint32 local_47c;
  uint8 *puStack_478;
  uint32 raw_len;
  uint8 *p;
  int local_468;
  int filter;
  int comp;
  int interlace;
  int color;
  int depth;
  chunk c;
  stbi *s;
  int k;
  int first;
  uint32 pal_len;
  uint32 i;
  uint32 idata_limit;
  uint32 ioff;
  uint8 local_428 [3];
  uint8 tc [3];
  uint8 has_trans;
  uint8 pal_img_n;
  uint8 palette [1024];
  int req_comp_local;
  int scan_local;
  png *z_local;
  
  ioff._3_1_ = 0;
  ioff._2_1_ = '\0';
  i = 0;
  pal_len = 0;
  k = 0;
  bVar1 = true;
  c = (chunk)z;
  iVar3 = check_png_header(&z->s);
  if (iVar3 == 0) {
    z_local._4_4_ = 0;
  }
  else {
    if (scan != 1) {
      do {
        _color = get_chunk_header((stbi *)c);
        if ((bVar1) && (depth != 0x49484452)) {
          iVar3 = e("Corrupt PNG");
          return iVar3;
        }
        if (depth == 0x49444154) {
          if ((ioff._3_1_ != 0) && (k == 0)) {
            iVar3 = e("Corrupt PNG");
            return iVar3;
          }
          if (scan == 2) {
            *(uint *)((long)c + 8) = (uint)ioff._3_1_;
            return 1;
          }
          if (pal_len < i + color) {
            if (pal_len == 0) {
              if ((uint)color < 0x1001) {
                local_484 = 0x1000;
              }
              else {
                local_484 = color;
              }
              pal_len = local_484;
            }
            for (; pal_len < i + color; pal_len = pal_len << 1) {
            }
            puStack_478 = (uint8 *)realloc(z->idata,(ulong)pal_len);
            if (puStack_478 == (uint8 *)0x0) {
              iVar3 = e("Out of memory");
              return iVar3;
            }
            z->idata = puStack_478;
          }
          if (*(long *)((long)c + 0x10) == 0) {
            memcpy(z->idata + i,*(void **)((long)c + 0x18),(ulong)_color & 0xffffffff);
            *(ulong *)((long)c + 0x18) = *(long *)((long)c + 0x18) + ((ulong)_color & 0xffffffff);
          }
          else {
            sVar5 = fread(z->idata + i,1,(ulong)_color & 0xffffffff,*(FILE **)((long)c + 0x10));
            if (sVar5 != ((ulong)_color & 0xffffffff)) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
          }
          i = color + i;
        }
        else {
          if (depth == 0x49454e44) {
            if (scan != 0) {
              return 1;
            }
            if (z->idata == (uint8 *)0x0) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            puVar6 = (uint8 *)stbi_zlib_decode_malloc((char *)z->idata,i,(int *)&local_47c);
            z->expanded = puVar6;
            if (z->expanded == (uint8 *)0x0) {
              return 0;
            }
            free(z->idata);
            z->idata = (uint8 *)0x0;
            if ((((req_comp == *(int *)((long)c + 8) + 1) && (req_comp != 3)) && (ioff._3_1_ == 0))
               || (ioff._2_1_ != '\0')) {
              *(int *)((long)c + 0xc) = *(int *)((long)c + 8) + 1;
            }
            else {
              *(undefined4 *)((long)c + 0xc) = *(undefined4 *)((long)c + 8);
            }
            iVar3 = create_png_image(z,z->expanded,local_47c,*(int *)((long)c + 0xc));
            if (iVar3 != 0) {
              if ((ioff._2_1_ != '\0') &&
                 (iVar3 = compute_transparency
                                    (z,(uint8 *)((long)&idata_limit + 3),*(int *)((long)c + 0xc)),
                 iVar3 == 0)) {
                return 0;
              }
              if (ioff._3_1_ != 0) {
                *(uint *)((long)c + 8) = (uint)ioff._3_1_;
                *(uint *)((long)c + 0xc) = (uint)ioff._3_1_;
                if (2 < req_comp) {
                  *(int *)((long)c + 0xc) = req_comp;
                }
                iVar3 = expand_palette(z,local_428,k,*(int *)((long)c + 0xc));
                if (iVar3 == 0) {
                  return 0;
                }
              }
              free(z->expanded);
              z->expanded = (uint8 *)0x0;
              return 1;
            }
            return 0;
          }
          if (depth == 0x49484452) {
            if (!bVar1) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            if (color != 0xd) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            uVar4 = get32((stbi *)c);
            *(uint32 *)c = uVar4;
            if (0x1000000 < *(uint *)c) {
              iVar3 = e("Very large image (corrupt?)");
              return iVar3;
            }
            uVar4 = get32((stbi *)c);
            *(uint32 *)((long)c + 4) = uVar4;
            if (0x1000000 < *(uint *)((long)c + 4)) {
              iVar3 = e("Very large image (corrupt?)");
              return iVar3;
            }
            interlace = get8((stbi *)c);
            if (interlace != 8) {
              iVar3 = e("PNG not supported: 8-bit only");
              return iVar3;
            }
            comp = get8((stbi *)c);
            if (6 < comp) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            if (comp == 3) {
              ioff._3_1_ = 3;
            }
            else if ((comp & 1U) != 0) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            local_468 = get8((stbi *)c);
            if (local_468 != 0) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            p._4_4_ = get8((stbi *)c);
            if (p._4_4_ != 0) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            filter = get8((stbi *)c);
            if (filter != 0) {
              iVar3 = e("PNG not supported: interlaced mode");
              return iVar3;
            }
            if ((*(int *)c == 0) || (*(int *)((long)c + 4) == 0)) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            if (ioff._3_1_ == 0) {
              iVar3 = 1;
              if ((comp & 2U) != 0) {
                iVar3 = 3;
              }
              *(uint *)((long)c + 8) = iVar3 + (uint)((comp & 4U) != 0);
              if ((uint)((0x40000000 / (ulong)*(uint *)c) / (ulong)*(uint *)((long)c + 8)) <
                  *(uint *)((long)c + 4)) {
                iVar3 = e("Image too large to decode");
                return iVar3;
              }
              if (scan == 2) {
                return 1;
              }
            }
            else {
              *(undefined4 *)((long)c + 8) = 1;
              if ((uint)(0x40000000 / (ulong)*(uint *)c >> 2) < *(uint *)((long)c + 4)) {
                iVar3 = e("Corrupt PNG");
                return iVar3;
              }
            }
            filter = 0;
          }
          else if (depth == 0x504c5445) {
            if (0x300 < (uint)color) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            k = (uint)color / 3;
            if (k * 3 != color) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            for (first = 0; (uint)first < (uint)k; first = first + 1) {
              uVar2 = get8u((stbi *)c);
              local_428[(uint)(first << 2)] = uVar2;
              uVar2 = get8u((stbi *)c);
              local_428[first * 4 + 1] = uVar2;
              uVar2 = get8u((stbi *)c);
              local_428[first * 4 + 2] = uVar2;
              local_428[first * 4 + 3] = 0xff;
            }
          }
          else if (depth == 0x74524e53) {
            if (z->idata != (uint8 *)0x0) {
              iVar3 = e("Corrupt PNG");
              return iVar3;
            }
            if (ioff._3_1_ == 0) {
              if ((*(uint *)((long)c + 8) & 1) == 0) {
                iVar3 = e("Corrupt PNG");
                return iVar3;
              }
              if (color != *(int *)((long)c + 8) * 2) {
                iVar3 = e("Corrupt PNG");
                return iVar3;
              }
              ioff._2_1_ = '\x01';
              for (s._0_4_ = 0; (int)s < *(int *)((long)c + 8); s._0_4_ = (int)s + 1) {
                iVar3 = get16((stbi *)c);
                *(char *)((long)&idata_limit + (long)(int)s + 3) = (char)iVar3;
              }
            }
            else {
              if (scan == 2) {
                *(undefined4 *)((long)c + 8) = 4;
                return 1;
              }
              if (k == 0) {
                iVar3 = e("Corrupt PNG");
                return iVar3;
              }
              if ((uint)k < (uint)color) {
                iVar3 = e("Corrupt PNG");
                return iVar3;
              }
              ioff._3_1_ = 4;
              for (first = 0; (uint)first < (uint)color; first = first + 1) {
                uVar2 = get8u((stbi *)c);
                local_428[first * 4 + 3] = uVar2;
              }
            }
          }
          else {
            if (((ulong)_color & 0x2000000000000000) == 0) {
              parse_png_file::invalid_chunk[0] = color._7_1_;
              parse_png_file::invalid_chunk[1] = color._6_1_;
              parse_png_file::invalid_chunk[2] = color._5_1_;
              parse_png_file::invalid_chunk[3] = color._4_1_;
              iVar3 = e("PNG not supported: unknown chunk type");
              return iVar3;
            }
            skip((stbi *)c,color);
          }
        }
        get32((stbi *)c);
        bVar1 = false;
      } while( true );
    }
    z_local._4_4_ = 1;
  }
  return z_local._4_4_;
}

Assistant:

static int parse_png_file(png *z, int scan, int req_comp)
{
   uint8 palette[1024], pal_img_n=0;
   uint8 has_trans=0, tc[3];
   uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k;
   stbi *s = &z->s;

   if (!check_png_header(s)) return 0;

   if (scan == SCAN_type) return 1;

   for(;;first=0) {
      chunk c = get_chunk_header(s);
      if (first && c.type != PNG_TYPE('I','H','D','R'))
         return e("first not IHDR","Corrupt PNG");
      switch (c.type) {
         case PNG_TYPE('I','H','D','R'): {
            int depth,color,interlace,comp,filter;
            if (!first) return e("multiple IHDR","Corrupt PNG");
            if (c.length != 13) return e("bad IHDR len","Corrupt PNG");
            s->img_x = get32(s); if (s->img_x > (1 << 24)) return e("too large","Very large image (corrupt?)");
            s->img_y = get32(s); if (s->img_y > (1 << 24)) return e("too large","Very large image (corrupt?)");
            depth = get8(s);  if (depth != 8)        return e("8bit only","PNG not supported: 8-bit only");
            color = get8(s);  if (color > 6)         return e("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return e("bad ctype","Corrupt PNG");
            comp  = get8(s);  if (comp) return e("bad comp method","Corrupt PNG");
            filter= get8(s);  if (filter) return e("bad filter method","Corrupt PNG");
            interlace = get8(s); if (interlace) return e("interlaced","PNG not supported: interlaced mode");
            if (!s->img_x || !s->img_y) return e("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return e("too large", "Image too large to decode");
               if (scan == SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return e("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case PNG_TYPE('P','L','T','E'):  {
            if (c.length > 256*3) return e("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return e("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = get8u(s);
               palette[i*4+1] = get8u(s);
               palette[i*4+2] = get8u(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case PNG_TYPE('t','R','N','S'): {
            if (z->idata) return e("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return e("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return e("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = get8u(s);
            } else {
               if (!(s->img_n & 1)) return e("tRNS with alpha","Corrupt PNG");
               if (c.length != (uint32) s->img_n*2) return e("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (uint8) get16(s); // non 8-bit images will be larger
            }
            break;
         }

         case PNG_TYPE('I','D','A','T'): {
            if (pal_img_n && !pal_len) return e("no PLTE","Corrupt PNG");
            if (scan == SCAN_header) { s->img_n = pal_img_n; return 1; }
            if (ioff + c.length > idata_limit) {
               uint8 *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (uint8 *) realloc(z->idata, idata_limit); if (p == NULL) return e("outofmem", "Out of memory");
               z->idata = p;
            }
            #ifndef STBI_NO_STDIO
            if (s->img_file)
            {
               if (fread(z->idata+ioff,1,c.length,s->img_file) != c.length) return e("outofdata","Corrupt PNG");
            }
            else
            #endif
            {
               memcpy(z->idata+ioff, s->img_buffer, c.length);
               s->img_buffer += c.length;
            }
            ioff += c.length;
            break;
         }

         case PNG_TYPE('I','E','N','D'): {
            uint32 raw_len;
            if (scan != SCAN_load) return 1;
            if (z->idata == NULL) return e("no IDAT","Corrupt PNG");
            z->expanded = (uint8 *) stbi_zlib_decode_malloc((char *) z->idata, ioff, (int *) &raw_len);
            if (z->expanded == NULL) return 0; // zlib should set error
            free(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!create_png_image(z, z->expanded, raw_len, s->img_out_n)) return 0;
            if (has_trans)
               if (!compute_transparency(z, tc, s->img_out_n)) return 0;
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!expand_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            free(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX chunk not known";
               invalid_chunk[0] = (uint8) (c.type >> 24);
               invalid_chunk[1] = (uint8) (c.type >> 16);
               invalid_chunk[2] = (uint8) (c.type >>  8);
               invalid_chunk[3] = (uint8) (c.type >>  0);
               #endif
               return e(invalid_chunk, "PNG not supported: unknown chunk type");
            }
            skip(s, c.length);
            break;
      }
      // end of chunk, read and skip CRC
      get32(s);
   }
}